

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::LowerJumpTableMultiBranch(Lowerer *this,MultiBranchInstr *multiBrInstr,RegOpnd *indexOpnd)

{
  Func *func_00;
  code *pcVar1;
  bool bVar2;
  BYTE scale;
  RegOpnd *dst;
  LabelInstr *labelInstr;
  LabelOpnd *src;
  RegOpnd *baseOpnd;
  BranchJumpTable *pBVar3;
  undefined4 *puVar4;
  IndirOpnd *src_00;
  Instr *this_00;
  Opnd *newSrc;
  Instr *indirInstr;
  Opnd *opndSrc;
  BYTE indirScale;
  BranchJumpTableWrapper *branchJumpTable;
  RegOpnd *nativeJumpTableReg;
  LabelOpnd *nativeJumpTable;
  LabelInstr *nativeJumpTableLabel;
  Opnd *opndDst;
  Func *func;
  RegOpnd *indexOpnd_local;
  MultiBranchInstr *multiBrInstr_local;
  Lowerer *this_local;
  
  func_00 = this->m_func;
  dst = IR::RegOpnd::New(TyUint64,func_00);
  labelInstr = IR::LabelInstr::New(Label,this->m_func,false);
  labelInstr->field_0x78 = labelInstr->field_0x78 & 0xf7 | 8;
  src = IR::LabelOpnd::New(labelInstr,this->m_func);
  baseOpnd = IR::RegOpnd::New(TyUint64,func_00);
  InsertMove(&baseOpnd->super_Opnd,&src->super_Opnd,(Instr *)multiBrInstr,true);
  pBVar3 = IR::MultiBranchInstr::GetBranchJumpTable(multiBrInstr);
  if (pBVar3->labelInstr != (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x27ee,"(branchJumpTable->labelInstr == nullptr)",
                       "Should not be already assigned");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pBVar3->labelInstr = labelInstr;
  scale = LowererMD::GetDefaultIndirScale();
  src_00 = IR::IndirOpnd::New(baseOpnd,indexOpnd,scale,TyInt64,this->m_func);
  this_00 = InsertMove(&dst->super_Opnd,&src_00->super_Opnd,(Instr *)multiBrInstr,true);
  newSrc = IR::Instr::GetDst(this_00);
  IR::Instr::SetSrc1((Instr *)multiBrInstr,newSrc);
  (multiBrInstr->super_BranchInstr).super_Instr.m_opcode = JMP;
  return;
}

Assistant:

void
Lowerer::LowerJumpTableMultiBranch(IR::MultiBranchInstr * multiBrInstr, IR::RegOpnd * indexOpnd)
{
    Func * func = this->m_func;
    IR::Opnd * opndDst = IR::RegOpnd::New(TyMachPtr, func);
    //Move the native address of the jump table to a register
    IR::LabelInstr * nativeJumpTableLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);
    nativeJumpTableLabel->m_isDataLabel = true;
    IR::LabelOpnd * nativeJumpTable = IR::LabelOpnd::New(nativeJumpTableLabel, m_func);
    IR::RegOpnd * nativeJumpTableReg = IR::RegOpnd::New(TyMachPtr, func);
    InsertMove(nativeJumpTableReg, nativeJumpTable, multiBrInstr);

    BranchJumpTableWrapper * branchJumpTable = multiBrInstr->GetBranchJumpTable();
    AssertMsg(branchJumpTable->labelInstr == nullptr, "Should not be already assigned");
    branchJumpTable->labelInstr = nativeJumpTableLabel;

    //Indirect addressing @ target location in the jump table.
    //MOV eax, [nativeJumpTableReg + (offset * indirScale)]
    BYTE indirScale = this->m_lowererMD.GetDefaultIndirScale();
    IR::Opnd * opndSrc = IR::IndirOpnd::New(nativeJumpTableReg, indexOpnd, indirScale, TyMachReg, this->m_func);

    IR::Instr * indirInstr = InsertMove(opndDst, opndSrc, multiBrInstr);

    //MultiBr eax
    multiBrInstr->SetSrc1(indirInstr->GetDst());

    //Jump to the address at the target location in the jump table
    multiBrInstr->m_opcode = LowererMD::MDMultiBranchOpcode;
}